

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O0

void PatchHandleArchipelago::add_proc_handle_archipelago_items_on_ground(ROM *rom)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  initializer_list<unsigned_char> __l_03;
  size_t sVar1;
  uint32_t uVar2;
  Code *pCVar3;
  Code local_478;
  allocator<char> local_3f9;
  string local_3f8;
  uint32_t local_3d8;
  allocator<char> local_3d1;
  uint32_t addr;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  DataRegister local_360;
  Param local_350 [2];
  DataRegister local_340;
  DataRegister local_330;
  allocator<md::AddressRegister> local_319;
  AddressRegister local_318;
  iterator local_308;
  size_type local_300;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_2f8;
  allocator<md::DataRegister> local_2d9;
  DataRegister local_2d8;
  DataRegister local_2c8;
  iterator local_2b8;
  size_type local_2b0;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_2a8;
  DataRegister local_290;
  AddressRegister local_280;
  AddressWithIndex local_270;
  DataRegister local_250;
  AddressRegister local_240;
  DataRegister local_230;
  DataRegister local_220;
  DataRegister local_210;
  DataRegister local_200;
  allocator<md::AddressRegister> local_1e9;
  AddressRegister local_1e8;
  iterator local_1d8;
  size_type local_1d0;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_1c8;
  allocator<md::DataRegister> local_1a9;
  DataRegister local_1a8;
  DataRegister local_198;
  iterator local_188;
  size_type local_180;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_178;
  DataRegister local_160;
  DataRegister local_150;
  AddressRegister local_140;
  AddressInRegister local_130;
  DataRegister local_110;
  allocator<unsigned_char> local_fb;
  uchar local_fa [2];
  iterator local_f8;
  size_type local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  allocator<char> local_c9;
  string local_c8;
  DataRegister local_98;
  undefined1 local_88 [8];
  Code proc;
  ROM *rom_local;
  
  proc._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_88);
  md::DataRegister::DataRegister(&local_98,'\0');
  md::Code::cmpib((Code *)local_88,'\x7f',(Param *)&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"not_archipelago",&local_c9);
  md::Code::bne((Code *)local_88,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_fa[0] = '\0';
  local_fa[1] = 5;
  local_f8 = local_fa;
  local_f0 = 2;
  std::allocator<unsigned_char>::allocator(&local_fb);
  __l_03._M_len = local_f0;
  __l_03._M_array = local_f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e8,__l_03,&local_fb);
  md::Code::trap((Code *)local_88,'\0',&local_e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e8);
  std::allocator<unsigned_char>::~allocator(&local_fb);
  md::DataRegister::DataRegister(&local_110,'\a');
  md::Code::clrw((Code *)local_88,(Param *)&local_110);
  md::AddressRegister::AddressRegister(&local_140,'\x05');
  addr_<int>(&local_130,&local_140,0x3a);
  md::DataRegister::DataRegister(&local_150,'\a');
  md::Code::moveb((Code *)local_88,&local_130.super_Param,(Param *)&local_150);
  md::DataRegister::DataRegister(&local_160,'\a');
  md::Code::lsrb((Code *)local_88,'\x02',&local_160);
  md::DataRegister::DataRegister(&local_1a8,'\0');
  md::DataRegister::DataRegister(&local_198,'\a');
  local_188 = &local_1a8;
  local_180 = 2;
  std::allocator<md::DataRegister>::allocator(&local_1a9);
  __l_02._M_len = local_180;
  __l_02._M_array = local_188;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_178,__l_02,&local_1a9);
  md::AddressRegister::AddressRegister(&local_1e8,'\0');
  local_1d8 = &local_1e8;
  local_1d0 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_1e9);
  __l_01._M_len = local_1d0;
  __l_01._M_array = local_1d8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_1c8,__l_01,&local_1e9);
  md::Code::movem_to_stack((Code *)local_88,&local_178,&local_1c8);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_1c8);
  std::allocator<md::AddressRegister>::~allocator(&local_1e9);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_178);
  std::allocator<md::DataRegister>::~allocator(&local_1a9);
  md::DataRegister::DataRegister(&local_200,'\a');
  md::DataRegister::DataRegister(&local_210,'\0');
  md::Code::movel((Code *)local_88,(Param *)&local_200,(Param *)&local_210);
  md::DataRegister::DataRegister(&local_220,'\a');
  md::Code::andib((Code *)local_88,'\a',(Param *)&local_220);
  md::DataRegister::DataRegister(&local_230,'\0');
  md::Code::lsrb((Code *)local_88,'\x03',&local_230);
  md::AddressRegister::AddressRegister(&local_240,'\0');
  md::Code::lea((Code *)local_88,0xff1060,&local_240);
  md::DataRegister::DataRegister(&local_250,'\a');
  md::AddressRegister::AddressRegister(&local_280,'\0');
  md::DataRegister::DataRegister(&local_290,'\0');
  addr_<void>(&local_270,&local_280,&local_290,'\0',LONG);
  md::Code::bset((Code *)local_88,&local_250,&local_270.super_Param);
  md::DataRegister::DataRegister(&local_2d8,'\0');
  md::DataRegister::DataRegister(&local_2c8,'\a');
  local_2b8 = &local_2d8;
  local_2b0 = 2;
  std::allocator<md::DataRegister>::allocator(&local_2d9);
  __l_00._M_len = local_2b0;
  __l_00._M_array = local_2b8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_2a8,__l_00,&local_2d9);
  md::AddressRegister::AddressRegister(&local_318,'\0');
  local_308 = &local_318;
  local_300 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_319);
  __l._M_len = local_300;
  __l._M_array = local_308;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_2f8,__l,&local_319);
  md::Code::movem_from_stack((Code *)local_88,&local_2a8,&local_2f8);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_2f8);
  std::allocator<md::AddressRegister>::~allocator(&local_319);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_2a8);
  std::allocator<md::DataRegister>::~allocator(&local_2d9);
  md::DataRegister::DataRegister(&local_330,'\a');
  md::Code::addiw((Code *)local_88,0x200,(Param *)&local_330);
  md::DataRegister::DataRegister(&local_340,'\a');
  addr_<void>((uint32_t)local_350,0xff0026);
  md::Code::movew((Code *)local_88,(Param *)&local_340,local_350);
  md::DataRegister::DataRegister(&local_360,'\0');
  md::Code::movew((Code *)local_88,0x1e,(Param *)&local_360);
  md::Code::jsr((Code *)local_88,0x28fd8);
  md::Code::jmp((Code *)local_88,0x24b30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"not_archipelago",&local_381);
  md::Code::label((Code *)local_88,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  md::Code::jsr((Code *)local_88,0x29232);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"jmp_to_24AF4",&local_3a9)
  ;
  md::Code::bne((Code *)local_88,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  md::Code::jmp((Code *)local_88,0x24aea);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&addr,"jmp_to_24AF4",&local_3d1);
  md::Code::label((Code *)local_88,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  std::allocator<char>::~allocator(&local_3d1);
  md::Code::jmp((Code *)local_88,0x24af4);
  sVar1 = proc._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"",&local_3f9);
  uVar2 = md::ROM::inject_code((ROM *)sVar1,(Code *)local_88,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  sVar1 = proc._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_478._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_478._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_478._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_478._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_478._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_478._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_478._labels._M_t._M_impl._0_8_ = 0;
  local_478._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_478._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_478._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_478._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_478._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_478._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478._pending_branches._M_t._M_impl._0_8_ = 0;
  local_478._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_478._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3d8 = uVar2;
  md::Code::Code(&local_478);
  pCVar3 = md::Code::jmp(&local_478,local_3d8);
  pCVar3 = md::Code::nop(pCVar3,1);
  md::ROM::set_code((ROM *)sVar1,0x24ae4,pCVar3);
  md::Code::~Code(&local_478);
  md::Code::~Code((Code *)local_88);
  return;
}

Assistant:

static void add_proc_handle_archipelago_items_on_ground(md::ROM& rom)
    {
        md::Code proc;
        {
            proc.cmpib(ITEM_ARCHIPELAGO, reg_D0);
            proc.bne("not_archipelago");
            {
                proc.trap(0x00, { 0x00, 0x05 });  // Play "get item" jingle

                // Update current ground item UUID
                proc.clrw(reg_D7);
                proc.moveb(addr_(reg_A5, 0x3A), reg_D7);  // Ground ID stored as dialogue
                proc.lsrb(2, reg_D7);                     //   / 4

                // Set the ground check flag manually since we skip the "GetItem" function
                proc.movem_to_stack({ reg_D0, reg_D7 }, { reg_A0 });
                proc.movel(reg_D7, reg_D0);
                proc.andib(0x07, reg_D7);      // D7 contains flag bit
                proc.lsrb(3, reg_D0);          // D0 contains flag byte
                proc.lea(0xFF1060, reg_A0);
                proc.bset(reg_D7, addr_(reg_A0, reg_D0));
                proc.movem_from_stack({ reg_D0, reg_D7 }, { reg_A0 });

                proc.addiw(0x200, reg_D7);                // add 0x200 to ground_item_id to get UUID
                proc.movew(reg_D7, addr_(ADDR_ARCHIPELAGO_CURRENT_LOCATION_UUID));

                proc.movew(0x1E, reg_D0); // "Sent {ITEM}"
                proc.jsr(0x28FD8);        // DisplayText
                proc.jmp(0x24B30);        // Return to normal flow not giving any item
            }
            proc.label("not_archipelago");
            // Item is regular, perform the checks as usual
            proc.jsr(0x29232); // GetRemainingItemAllowedCount
            proc.bne("jmp_to_24AF4");
            proc.jmp(0x24AEA);
            proc.label("jmp_to_24AF4");
            proc.jmp(0x24AF4);
        }

        uint32_t addr = rom.inject_code(proc);
        rom.set_code(0x24AE4, md::Code().jmp(addr).nop());
    }